

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac_oggbs__seek_physical
                    (ma_dr_flac_oggbs *oggbs,ma_uint64 offset,ma_dr_flac_seek_origin origin)

{
  int iVar1;
  int in_EDX;
  ma_dr_flac_oggbs *in_RSI;
  long in_RDI;
  ma_dr_flac_seek_origin in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  ma_bool32 local_4;
  
  if (in_EDX == 0) {
    if (in_RSI < (ma_dr_flac_oggbs *)0x80000000) {
      iVar1 = (**(code **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 0x10),(ulong)in_RSI & 0xffffffff,0)
      ;
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        *(ma_dr_flac_oggbs **)(in_RDI + 0x18) = in_RSI;
        local_4 = 1;
      }
    }
    else {
      iVar1 = (**(code **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 0x10),0x7fffffff,0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        *(ma_dr_flac_oggbs **)(in_RDI + 0x18) = in_RSI;
        local_4 = ma_dr_flac_oggbs__seek_physical
                            (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
      }
    }
  }
  else {
    for (; (ma_dr_flac_oggbs *)0x7fffffff < in_RSI;
        in_RSI = (ma_dr_flac_oggbs *)(in_RSI[-0x7f36].pageData + 0xbb99)) {
      iVar1 = (**(code **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 0x10),0x7fffffff,1);
      if (iVar1 == 0) {
        return 0;
      }
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 0x7fffffff;
    }
    iVar1 = (**(code **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 0x10),(ulong)in_RSI & 0xffffffff,1);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      *(ma_uint8 **)(in_RDI + 0x18) =
           (in_RSI->bosPageHeader).capturePattern + *(long *)(in_RDI + 0x18) + -0x30;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_flac_oggbs__seek_physical(ma_dr_flac_oggbs* oggbs, ma_uint64 offset, ma_dr_flac_seek_origin origin)
{
    if (origin == ma_dr_flac_seek_origin_start) {
        if (offset <= 0x7FFFFFFF) {
            if (!oggbs->onSeek(oggbs->pUserData, (int)offset, ma_dr_flac_seek_origin_start)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos = offset;
            return MA_TRUE;
        } else {
            if (!oggbs->onSeek(oggbs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_start)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos = offset;
            return ma_dr_flac_oggbs__seek_physical(oggbs, offset - 0x7FFFFFFF, ma_dr_flac_seek_origin_current);
        }
    } else {
        while (offset > 0x7FFFFFFF) {
            if (!oggbs->onSeek(oggbs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos += 0x7FFFFFFF;
            offset -= 0x7FFFFFFF;
        }
        if (!oggbs->onSeek(oggbs->pUserData, (int)offset, ma_dr_flac_seek_origin_current)) {
            return MA_FALSE;
        }
        oggbs->currentBytePos += offset;
        return MA_TRUE;
    }
}